

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardStringIterator.h
# Opt level: O2

ssize_t __thiscall
bwtil::BackwardStringIterator::read
          (BackwardStringIterator *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  
  if (this->position != 0) {
    this->position = this->position - 1;
    puVar1 = (undefined1 *)std::__cxx11::string::at((ulong)&this->in_str);
    return CONCAT71((int7)((ulong)puVar1 >> 8),*puVar1);
  }
  return 0;
}

Assistant:

symbol read(){

		if(position>0){

			position--;
			return in_str.at(position);

		}

		return 0;

	}